

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# flow.c
# Opt level: O1

void kill_dead_stores(dmr_C *C,pseudo_t pseudo,unsigned_long generation,basic_block *bb,int local)

{
  uint *puVar1;
  basic_block *bb_00;
  basic_block *pbVar2;
  uint uVar3;
  byte bVar4;
  undefined1 local_70 [8];
  ptr_list_iter childiter__;
  ptr_list_iter insniter__;
  
  if (bb->generation != generation) {
    bb->generation = generation;
    ptrlist_reverse_iterator((ptr_list_iter *)&childiter__.__nr,(ptr_list *)bb->insns);
    puVar1 = (uint *)ptrlist_iter_prev((ptr_list_iter *)&childiter__.__nr);
    if (puVar1 != (uint *)0x0) {
      do {
        uVar3 = *puVar1 & 0xff;
        if (uVar3 - 0x2b < 0xfffffffe) {
          bVar4 = 4;
          if (local == 0) {
            bVar4 = (uVar3 != 0x35) * '\x03' + 1;
          }
        }
        else if (*(pseudo_t *)(puVar1 + 10) == pseudo) {
          bVar4 = 1;
          if (uVar3 != 0x29) {
            puVar1[2] = 0;
            puVar1[3] = 0;
            *puVar1 = *puVar1 & 0xffffff00 | 0x39;
            dmrC_kill_use(C,(pseudo_t *)(puVar1 + 8));
            bVar4 = 4;
          }
        }
        else {
          bVar4 = 4;
          if (local == 0) {
            bVar4 = (*(pseudo_t *)(puVar1 + 10))->type != PSEUDO_SYM;
          }
        }
        if ((bVar4 & 3) != 0) goto LAB_0012df08;
        puVar1 = (uint *)ptrlist_iter_prev((ptr_list_iter *)&childiter__.__nr);
      } while (puVar1 != (uint *)0x0);
      bVar4 = 0;
LAB_0012df08:
      if (bVar4 != 0) {
        return;
      }
    }
    ptrlist_forward_iterator((ptr_list_iter *)&childiter__.__nr,(ptr_list *)bb->parents);
    bb_00 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&childiter__.__nr);
    if (bb_00 != (basic_block *)0x0) {
      do {
        ptrlist_forward_iterator((ptr_list_iter *)local_70,(ptr_list *)bb_00->children);
        while (pbVar2 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)local_70),
              pbVar2 != (basic_block *)0x0) {
          if (pbVar2 != bb) {
            return;
          }
        }
        kill_dead_stores(C,pseudo,generation,bb_00,local);
        bb_00 = (basic_block *)ptrlist_iter_next((ptr_list_iter *)&childiter__.__nr);
      } while (bb_00 != (basic_block *)0x0);
    }
  }
  return;
}

Assistant:

static void kill_dead_stores(struct dmr_C *C, pseudo_t pseudo, unsigned long generation, struct basic_block *bb, int local)
{
	struct instruction *insn;
	struct basic_block *parent;

	if (bb->generation == generation)
		return;
	bb->generation = generation;
	FOR_EACH_PTR_REVERSE(bb->insns, insn) {
		int opcode = insn->opcode;

		if (opcode != OP_LOAD && opcode != OP_STORE) {
			if (local)
				continue;
			if (opcode == OP_CALL)
				return;
			continue;
		}
		if (insn->src == pseudo) {
			if (opcode == OP_LOAD)
				return;
			kill_store(C, insn);
			continue;
		}
		if (local)
			continue;
		if (insn->src->type != PSEUDO_SYM)
			return;
	} END_FOR_EACH_PTR_REVERSE(insn);

	FOR_EACH_PTR(bb->parents, parent) {
		struct basic_block *child;
		FOR_EACH_PTR(parent->children, child) {
			if (child && child != bb)
				return;
		} END_FOR_EACH_PTR(child);
		kill_dead_stores(C, pseudo, generation, parent, local);
	} END_FOR_EACH_PTR(parent);
}